

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O1

OneofGeneratorInfo * __thiscall
google::protobuf::compiler::java::Context::GetOneofGeneratorInfo
          (Context *this,OneofDescriptor *oneof)

{
  _Base_ptr p_Var1;
  LogMessage *pLVar2;
  OneofGeneratorInfo *pOVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  LogFinisher local_49;
  LogMessage local_48;
  
  p_Var5 = &(this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var5->_M_header;
  for (; p_Var1 != (_Base_ptr)0x0;
      p_Var1 = (&p_Var1->_M_left)[*(OneofDescriptor **)(p_Var1 + 1) < oneof]) {
    if (*(OneofDescriptor **)(p_Var1 + 1) >= oneof) {
      p_Var4 = p_Var1;
    }
  }
  p_Var1 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var5) &&
     (p_Var1 = p_Var4, oneof < *(OneofDescriptor **)(p_Var4 + 1))) {
    p_Var1 = &p_Var5->_M_header;
  }
  if ((_Rb_tree_header *)p_Var1 == p_Var5) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
               ,0xba);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_48,"Can not find OneofGeneratorInfo for oneof: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,*(string **)(oneof + 8));
    internal::LogFinisher::operator=(&local_49,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
    pOVar3 = (OneofGeneratorInfo *)0x0;
  }
  else {
    pOVar3 = (OneofGeneratorInfo *)&p_Var1[1]._M_parent;
  }
  return pOVar3;
}

Assistant:

const OneofGeneratorInfo* Context::GetOneofGeneratorInfo(
    const OneofDescriptor* oneof) const {
  const OneofGeneratorInfo* result =
      FindOrNull(oneof_generator_info_map_, oneof);
  if (result == NULL) {
    GOOGLE_LOG(FATAL) << "Can not find OneofGeneratorInfo for oneof: "
               << oneof->name();
  }
  return result;
}